

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O0

int mi_posix_memalign(void **p,size_t alignment,size_t size)

{
  _Bool _Var1;
  void *pvVar2;
  size_t in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  void *q;
  size_t in_stack_ffffffffffffffd8;
  
  if ((((in_RDI != (undefined8 *)0x0) && ((in_RSI & 7) == 0)) && (in_RSI != 0)) &&
     (_Var1 = _mi_is_power_of_two(in_RSI), _Var1)) {
    pvVar2 = mi_malloc_aligned(in_RDX,in_stack_ffffffffffffffd8);
    if ((pvVar2 == (void *)0x0) && (in_RDX != 0)) {
      return 0xc;
    }
    *in_RDI = pvVar2;
    return 0;
  }
  return 0x16;
}

Assistant:

int mi_posix_memalign(void** p, size_t alignment, size_t size) mi_attr_noexcept {
  // Note: The spec dictates we should not modify `*p` on an error. (issue#27)
  // <http://man7.org/linux/man-pages/man3/posix_memalign.3.html>
  if (p == NULL) return EINVAL;
  if ((alignment % sizeof(void*)) != 0) return EINVAL;                 // natural alignment
  // it is also required that alignment is a power of 2 and > 0; this is checked in `mi_malloc_aligned`
  if (alignment==0 || !_mi_is_power_of_two(alignment)) return EINVAL;  // not a power of 2
  void* q = mi_malloc_aligned(size, alignment);
  if (q==NULL && size != 0) return ENOMEM;
  mi_assert_internal(((uintptr_t)q % alignment) == 0);
  *p = q;
  return 0;
}